

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnReturnCallExpr
          (BinaryReaderInterp *this,Index func_index)

{
  Istream *this_00;
  pointer pFVar1;
  Result RVar2;
  Index IVar3;
  Offset offset;
  u32 val;
  Enum EVar4;
  Index keep_count;
  Index drop_count;
  Location local_98;
  Var local_70;
  
  RVar2 = GetReturnCallDropKeepCount
                    (this,(this->func_types_).
                          super__Vector_base<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>
                          ._M_impl.super__Vector_impl_data._M_start + func_index,0,&drop_count,
                     &keep_count);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    local_98.field_1.field_0.line = 0;
    local_98.field_1._4_8_ = 0;
    local_98.filename.data_ = (char *)0x0;
    local_98.filename.size_._0_4_ = 0;
    local_98.filename.size_._4_4_ = 0;
    Var::Var(&local_70,func_index,&local_98);
    RVar2 = SharedValidator::OnReturnCall
                      (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                       &local_70);
    Var::~Var(&local_70);
    if (RVar2.enum_ != Error) {
      Istream::EmitDropKeep(this->istream_,drop_count,keep_count);
      IVar3 = num_func_imports(this);
      this_00 = this->istream_;
      if (func_index < IVar3) {
        Istream::Emit(this_00,InterpCallImport,func_index);
        Istream::Emit(this->istream_,Return);
      }
      else {
        pFVar1 = (this->module_->funcs).
                 super__Vector_base<wabt::interp::FuncDesc,_std::allocator<wabt::interp::FuncDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        val = pFVar1[func_index - IVar3].code_offset;
        if (val == 0xffffffff) {
          offset = Istream::end(this_00);
          FixupMap::Append(&this->func_fixups_,func_index,offset);
          val = pFVar1[func_index - IVar3].code_offset;
        }
        Istream::Emit(this_00,Br,val);
      }
      EVar4 = Ok;
    }
  }
  return (Result)EVar4;
}

Assistant:

Result BinaryReaderInterp::OnReturnCallExpr(Index func_index) {
  FuncType& func_type = func_types_[func_index];

  Index drop_count, keep_count;
  CHECK_RESULT(
      GetReturnCallDropKeepCount(func_type, 0, &drop_count, &keep_count));
  // The validator must be run after we get the drop/keep counts, since it
  // will change the type stack.
  CHECK_RESULT(validator_.OnReturnCall(loc, Var(func_index)));
  istream_.EmitDropKeep(drop_count, keep_count);

  if (func_index >= num_func_imports()) {
    istream_.Emit(Opcode::Br, GetFuncOffset(func_index));
  } else {
    istream_.Emit(Opcode::InterpCallImport, func_index);
    istream_.Emit(Opcode::Return);
  }

  return Result::Ok;
}